

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int ly_vlog_build_path_print
              (char **path,uint16_t *index,char *str,uint16_t str_len,uint16_t *length)

{
  ushort uVar1;
  char *__ptr;
  ushort uVar2;
  uint uVar3;
  
  uVar1 = *index;
  uVar3 = (uint)uVar1;
  __ptr = *path;
  if (uVar1 < str_len) {
    uVar2 = 0x80;
    if (0x80 < str_len) {
      uVar2 = str_len;
    }
    __ptr = (char *)realloc(__ptr,(ulong)((uint)*length + (uint)uVar1 + (uint)uVar2 + 1));
    if (__ptr == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "ly_vlog_build_path_print");
      return -1;
    }
    *path = __ptr;
    uVar3 = (uint)uVar2 + (uint)*index;
    memmove(__ptr + uVar3,__ptr + *index,(ulong)*length);
  }
  *index = (uint16_t)(uVar3 - str_len);
  memcpy(__ptr + (uVar3 - str_len & 0xffff),str,(ulong)str_len);
  *length = *length + str_len;
  return 0;
}

Assistant:

static int
ly_vlog_build_path_print(char **path, uint16_t *index, const char *str, uint16_t str_len, uint16_t *length)
{
    void *mem;
    uint16_t step;

    if ((*index) < str_len) {
        /* enlarge buffer */
        step = (str_len < LY_BUF_STEP) ? LY_BUF_STEP : str_len;
        mem = realloc(*path, *length + *index + step + 1);
        LY_CHECK_ERR_RETURN(!mem, LOGMEM(NULL), -1);
        *path = mem;

        /* move data, lengths */
        memmove(&(*path)[*index + step], &(*path)[*index], *length);
        (*index) += step;
    }

    (*index) -= str_len;
    memcpy(&(*path)[*index], str, str_len);
    *length += str_len;

    return 0;
}